

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O2

void __thiscall
llvm::DWARFFormValue::dump(DWARFFormValue *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  uint8_t *puVar1;
  Form FVar2;
  undefined6 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined2 uVar6;
  uint32_t Index;
  undefined1 this_00 [8];
  SectionedAddress *pSVar7;
  char *pcVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint8_t *puVar11;
  SectionedAddress SA;
  StringRef local_90;
  undefined1 local_80 [16];
  uint32_t local_70;
  undefined1 local_68 [8];
  Optional<llvm::object::SectionedAddress> A;
  
  uVar10 = (this->Value).field_0.uval;
  if (DumpOpts.ShowAddresses == false) {
    this_00 = (undefined1  [8])nulls();
  }
  else {
    WithColor::WithColor((WithColor *)local_68,OS,Address,false);
    this_00 = local_68;
    WithColor::~WithColor((WithColor *)local_68);
  }
  FVar2 = this->Form;
  uVar3 = A.Storage.field_0.value.SectionIndex._2_6_;
  uVar4 = A.Storage.field_0.value.SectionIndex._4_4_;
  Index = (uint32_t)uVar10;
  uVar5 = (undefined1)uVar10;
  uVar6 = (undefined2)uVar10;
  switch(FVar2) {
  case DW_FORM_addr:
    uVar10 = (this->Value).field_0.uval;
    uVar9 = (this->Value).SectionIndex;
    goto LAB_00d9b920;
  case 2:
  case DW_FORM_ref_sup4:
  case DW_FORM_strp_sup:
  case DW_FORM_implicit_const:
  case DW_FORM_loclistx:
  case DW_FORM_ref_sup8:
switchD_00d9b566_caseD_2:
    A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c539;
    local_68 = (undefined1  [8])&PTR_home_01127b20;
    A.Storage.field_0.value.SectionIndex._0_2_ = FVar2;
    A.Storage.field_0.value.SectionIndex = CONCAT62(uVar3,A.Storage.field_0._8_2_);
    break;
  case DW_FORM_block2:
  case DW_FORM_block4:
  case DW_FORM_block:
  case DW_FORM_block1:
  case DW_FORM_exprloc:
    if (uVar10 == 0) {
      return;
    }
    switch(FVar2) {
    case DW_FORM_block2:
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c434;
      local_68 = (undefined1  [8])&PTR_home_01127df8;
      A.Storage.field_0.value.SectionIndex._0_2_ = uVar6;
      A.Storage.field_0.value.SectionIndex = CONCAT62(uVar3,A.Storage.field_0._8_2_);
      break;
    case DW_FORM_block4:
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c43f;
      local_68 = (undefined1  [8])&PTR_home_01127cd0;
      A.Storage.field_0.value.SectionIndex._0_4_ = Index;
      A.Storage.field_0.value.SectionIndex = CONCAT44(uVar4,A.Storage.field_0._8_4_);
      break;
    case DW_FORM_data2:
    case DW_FORM_data4:
    case DW_FORM_data8:
    case DW_FORM_string:
      goto switchD_00d9b58d_caseD_5;
    case DW_FORM_block:
switchD_00d9b58d_caseD_9:
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c412;
      local_68 = (undefined1  [8])&PTR_home_01127cf0;
      A.Storage.field_0.value.SectionIndex = uVar10;
      break;
    case DW_FORM_block1:
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c41d;
      local_68 = (undefined1  [8])&PTR_home_01127e18;
      A.Storage.field_0.value.SectionIndex._0_1_ = uVar5;
      break;
    default:
      if (FVar2 == DW_FORM_exprloc) goto switchD_00d9b58d_caseD_9;
      goto switchD_00d9b58d_caseD_5;
    }
    raw_ostream::operator<<((raw_ostream *)this_00,(format_object_base *)local_68);
switchD_00d9b58d_caseD_5:
    puVar11 = (this->Value).data;
    if (puVar11 != (uint8_t *)0x0) {
      puVar1 = puVar11 + uVar10;
      for (; puVar11 < puVar1; puVar11 = puVar11 + 1) {
        A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c44a;
        local_68 = (undefined1  [8])&PTR_home_01127e18;
        A.Storage.field_0.value.SectionIndex._0_1_ = *puVar11;
        raw_ostream::operator<<((raw_ostream *)this_00,(format_object_base *)local_68);
      }
      return;
    }
    pcVar8 = "NULL";
    goto LAB_00d9bb8a;
  case DW_FORM_data2:
    A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_39a87d9;
    local_68 = (undefined1  [8])&PTR_home_01127df8;
    A.Storage.field_0.value.SectionIndex._0_2_ = uVar6;
    A.Storage.field_0.value.SectionIndex = CONCAT62(uVar3,A.Storage.field_0._8_2_);
    break;
  case DW_FORM_data4:
    pcVar8 = "0x%08x";
    goto LAB_00d9ba29;
  case DW_FORM_data8:
    A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_39a8837;
    local_68 = (undefined1  [8])&PTR_home_01127cf0;
    A.Storage.field_0.value.SectionIndex = uVar10;
    break;
  case DW_FORM_string:
    raw_ostream::operator<<(OS,'\"');
    StringRef::StringRef(&local_90,(this->Value).field_0.cstr);
    raw_ostream::write_escaped(OS,local_90,false);
    raw_ostream::operator<<(OS,'\"');
    return;
  case DW_FORM_data1:
  case DW_FORM_flag:
    A.Storage.field_0.value.Address = (long)" 0x%02x" + 1;
    local_68 = (undefined1  [8])&PTR_home_01127e18;
    A.Storage.field_0.value.SectionIndex._0_1_ = uVar5;
    break;
  case DW_FORM_sdata:
    raw_ostream::operator<<(OS,(this->Value).field_0.sval);
    return;
  case DW_FORM_strp:
    if (DumpOpts.Verbose != true) goto LAB_00d9b6c4;
    pcVar8 = " .debug_str[0x%8.8x] = ";
    goto LAB_00d9b69f;
  case DW_FORM_udata:
    raw_ostream::operator<<(OS,(this->Value).field_0.uval);
    return;
  case DW_FORM_ref_addr:
  case DW_FORM_ref_sig8:
    pcVar8 = "0x%016lx";
LAB_00d9ba93:
    local_68 = (undefined1  [8])&PTR_home_01127cf0;
    OS = (raw_ostream *)this_00;
    A.Storage.field_0.value.Address = (uint64_t)pcVar8;
    A.Storage.field_0.value.SectionIndex = uVar10;
    break;
  case DW_FORM_ref1:
    if (DumpOpts.Verbose == true) {
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c4bc;
      local_68 = (undefined1  [8])&PTR_home_01127e18;
      A.Storage.field_0.value.SectionIndex._0_1_ = uVar5;
LAB_00d9b994:
      raw_ostream::operator<<((raw_ostream *)this_00,(format_object_base *)local_68);
    }
    goto LAB_00d9b99c;
  case DW_FORM_ref2:
    if (DumpOpts.Verbose == true) {
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c4d3;
      local_68 = (undefined1  [8])&PTR_home_01127df8;
      A.Storage.field_0.value.SectionIndex._0_2_ = uVar6;
      A.Storage.field_0.value.SectionIndex = CONCAT62(uVar3,A.Storage.field_0._8_2_);
      goto LAB_00d9b994;
    }
    goto LAB_00d9b99c;
  case DW_FORM_ref4:
    if (DumpOpts.Verbose == true) {
      A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c4d3;
      local_68 = (undefined1  [8])&PTR_home_01127cd0;
      A.Storage.field_0.value.SectionIndex._0_4_ = Index;
      A.Storage.field_0.value.SectionIndex = CONCAT44(uVar4,A.Storage.field_0._8_4_);
      goto LAB_00d9b994;
    }
    goto LAB_00d9b99c;
  case DW_FORM_ref8:
    if (DumpOpts.Verbose == true) {
      pcVar8 = "cu + 0x%8.8lx";
LAB_00d9b77f:
      local_68 = (undefined1  [8])&PTR_home_01127cf0;
      A.Storage.field_0.value.Address = (uint64_t)pcVar8;
      A.Storage.field_0.value.SectionIndex = uVar10;
      goto LAB_00d9b994;
    }
    goto LAB_00d9b99c;
  case DW_FORM_ref_udata:
    if (DumpOpts.Verbose == true) {
      pcVar8 = "cu + 0x%lx";
      goto LAB_00d9b77f;
    }
LAB_00d9b99c:
    if (DumpOpts.Verbose != false) {
      raw_ostream::operator<<(OS," => {");
    }
    if (DumpOpts.ShowAddresses != false) {
      uVar9 = 0;
      WithColor::WithColor((WithColor *)local_80,OS,Address,false);
      if (this->U != (DWARFUnit *)0x0) {
        uVar9 = (this->U->Header).Offset;
      }
      A.Storage.field_0.value.SectionIndex = uVar9 + uVar10;
      A.Storage.field_0.value.Address = (long)"\n0x%8.8lx" + 1;
      local_68 = (undefined1  [8])&PTR_home_01127cf0;
      raw_ostream::operator<<((raw_ostream *)local_80._0_8_,(format_object_base *)local_68);
      WithColor::~WithColor((WithColor *)local_80);
    }
    if (DumpOpts.Verbose == false) {
      return;
    }
    pcVar8 = "}";
LAB_00d9bb8a:
    raw_ostream::operator<<(OS,pcVar8);
    return;
  case DW_FORM_indirect:
    pcVar8 = "DW_FORM_indirect";
    goto LAB_00d9bb8a;
  case DW_FORM_sec_offset:
    A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3acf148;
    local_68 = (undefined1  [8])&PTR_home_01127cd0;
    A.Storage.field_0.value.SectionIndex._0_4_ = Index;
    A.Storage.field_0.value.SectionIndex = CONCAT44(uVar4,A.Storage.field_0._8_4_);
    OS = (raw_ostream *)this_00;
    break;
  case DW_FORM_flag_present:
    pcVar8 = "true";
    goto LAB_00d9bb8a;
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4:
switchD_00d9b566_caseD_1a:
    if (DumpOpts.Verbose != true) goto LAB_00d9b6c4;
    pcVar8 = "indexed (%8.8x) string = ";
    goto LAB_00d9b69f;
  case DW_FORM_addrx:
  case DW_FORM_addrx1:
  case DW_FORM_addrx2:
  case DW_FORM_addrx3:
  case DW_FORM_addrx4:
switchD_00d9b566_caseD_1b:
    if (this->U == (DWARFUnit *)0x0) {
      pcVar8 = "<invalid dwarf unit>";
    }
    else {
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)local_68,this->U,Index);
      if ((A.Storage.field_0.value.SectionIndex._0_1_ != '\x01') ||
         (uVar5 = 1, DumpOpts.Verbose == true)) {
        local_80._8_8_ = "indexed (%8.8x) address = ";
        local_80._0_8_ = &PTR_home_01127cd0;
        local_70 = Index;
        raw_ostream::operator<<((raw_ostream *)this_00,(format_object_base *)local_80);
        uVar5 = A.Storage.field_0.value.SectionIndex._0_1_;
      }
      if ((uVar5 & 1) != 0) {
        pSVar7 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                           ((OptionalStorage<llvm::object::SectionedAddress,_true> *)local_68);
        uVar10 = pSVar7->Address;
        uVar9 = pSVar7->SectionIndex;
LAB_00d9b920:
        SA.SectionIndex = uVar9;
        SA.Address = uVar10;
        dumpSectionedAddress(this,(raw_ostream *)this_00,DumpOpts,SA);
        return;
      }
      pcVar8 = "<no .debug_addr section>";
    }
    goto LAB_00d9bb8a;
  case DW_FORM_data16:
    local_68 = (undefined1  [8])(this->Value).data;
    A.Storage.field_0.value.Address = 0x10;
    A.Storage.field_0.value.SectionIndex = 0;
    A.Storage.hasVal = false;
    raw_ostream::operator<<(OS,(FormattedBytes *)local_68);
    return;
  case DW_FORM_line_strp:
    if (DumpOpts.Verbose != true) goto LAB_00d9b6c4;
    pcVar8 = " .debug_line_str[0x%8.8x] = ";
LAB_00d9b69f:
    local_68 = (undefined1  [8])&PTR_home_01127cd0;
    A.Storage.field_0.value.SectionIndex._0_4_ = Index;
    A.Storage.field_0.value.SectionIndex = CONCAT44(uVar4,A.Storage.field_0._8_4_);
    A.Storage.field_0.value.Address = (uint64_t)pcVar8;
LAB_00d9b6bc:
    raw_ostream::operator<<(OS,(format_object_base *)local_68);
LAB_00d9b6c4:
    dumpString(this,OS);
    return;
  case DW_FORM_rnglistx:
    pcVar8 = "indexed (0x%x) rangelist = ";
LAB_00d9ba29:
    local_68 = (undefined1  [8])&PTR_home_01127cd0;
    A.Storage.field_0.value.SectionIndex._0_4_ = Index;
    A.Storage.field_0.value.SectionIndex = CONCAT44(uVar4,A.Storage.field_0._8_4_);
    A.Storage.field_0.value.Address = (uint64_t)pcVar8;
    break;
  default:
    if (FVar2 == DW_FORM_GNU_addr_index) goto switchD_00d9b566_caseD_1b;
    if (FVar2 == DW_FORM_GNU_str_index) goto switchD_00d9b566_caseD_1a;
    if (FVar2 == DW_FORM_GNU_ref_alt) {
      pcVar8 = "<alt 0x%lx>";
      goto LAB_00d9ba93;
    }
    if (FVar2 != DW_FORM_GNU_strp_alt) goto switchD_00d9b566_caseD_2;
    if (DumpOpts.Verbose != true) goto LAB_00d9b6c4;
    A.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_3b4c4a5;
    local_68 = (undefined1  [8])&PTR_home_01127cf0;
    A.Storage.field_0.value.SectionIndex = uVar10;
    goto LAB_00d9b6bc;
  }
  raw_ostream::operator<<(OS,(format_object_base *)local_68);
  return;
}

Assistant:

void DWARFFormValue::dump(raw_ostream &OS, DIDumpOptions DumpOpts) const {
  uint64_t UValue = Value.uval;
  bool CURelativeOffset = false;
  raw_ostream &AddrOS = DumpOpts.ShowAddresses
                            ? WithColor(OS, HighlightColor::Address).get()
                            : nulls();
  switch (Form) {
  case DW_FORM_addr:
    dumpSectionedAddress(AddrOS, DumpOpts, {Value.uval, Value.SectionIndex});
    break;
  case DW_FORM_addrx:
  case DW_FORM_addrx1:
  case DW_FORM_addrx2:
  case DW_FORM_addrx3:
  case DW_FORM_addrx4:
  case DW_FORM_GNU_addr_index: {
    if (U == nullptr) {
      OS << "<invalid dwarf unit>";
      break;
    }
    Optional<object::SectionedAddress> A = U->getAddrOffsetSectionItem(UValue);
    if (!A || DumpOpts.Verbose)
      AddrOS << format("indexed (%8.8x) address = ", (uint32_t)UValue);
    if (A)
      dumpSectionedAddress(AddrOS, DumpOpts, *A);
    else
      OS << "<no .debug_addr section>";
    break;
  }
  case DW_FORM_flag_present:
    OS << "true";
    break;
  case DW_FORM_flag:
  case DW_FORM_data1:
    OS << format("0x%02x", (uint8_t)UValue);
    break;
  case DW_FORM_data2:
    OS << format("0x%04x", (uint16_t)UValue);
    break;
  case DW_FORM_data4:
    OS << format("0x%08x", (uint32_t)UValue);
    break;
  case DW_FORM_ref_sig8:
    AddrOS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_data8:
    OS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_data16:
    OS << format_bytes(ArrayRef<uint8_t>(Value.data, 16), None, 16, 16);
    break;
  case DW_FORM_string:
    OS << '"';
    OS.write_escaped(Value.cstr);
    OS << '"';
    break;
  case DW_FORM_exprloc:
  case DW_FORM_block:
  case DW_FORM_block1:
  case DW_FORM_block2:
  case DW_FORM_block4:
    if (UValue > 0) {
      switch (Form) {
      case DW_FORM_exprloc:
      case DW_FORM_block:
        AddrOS << format("<0x%" PRIx64 "> ", UValue);
        break;
      case DW_FORM_block1:
        AddrOS << format("<0x%2.2x> ", (uint8_t)UValue);
        break;
      case DW_FORM_block2:
        AddrOS << format("<0x%4.4x> ", (uint16_t)UValue);
        break;
      case DW_FORM_block4:
        AddrOS << format("<0x%8.8x> ", (uint32_t)UValue);
        break;
      default:
        break;
      }

      const uint8_t *DataPtr = Value.data;
      if (DataPtr) {
        // UValue contains size of block
        const uint8_t *EndDataPtr = DataPtr + UValue;
        while (DataPtr < EndDataPtr) {
          AddrOS << format("%2.2x ", *DataPtr);
          ++DataPtr;
        }
      } else
        OS << "NULL";
    }
    break;

  case DW_FORM_sdata:
    OS << Value.sval;
    break;
  case DW_FORM_udata:
    OS << Value.uval;
    break;
  case DW_FORM_strp:
    if (DumpOpts.Verbose)
      OS << format(" .debug_str[0x%8.8x] = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_line_strp:
    if (DumpOpts.Verbose)
      OS << format(" .debug_line_str[0x%8.8x] = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4:
  case DW_FORM_GNU_str_index:
    if (DumpOpts.Verbose)
      OS << format("indexed (%8.8x) string = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_GNU_strp_alt:
    if (DumpOpts.Verbose)
      OS << format("alt indirect string, offset: 0x%" PRIx64 "", UValue);
    dumpString(OS);
    break;
  case DW_FORM_ref_addr:
    AddrOS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_ref1:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%2.2x", (uint8_t)UValue);
    break;
  case DW_FORM_ref2:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%4.4x", (uint16_t)UValue);
    break;
  case DW_FORM_ref4:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%4.4x", (uint32_t)UValue);
    break;
  case DW_FORM_ref8:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%8.8" PRIx64, UValue);
    break;
  case DW_FORM_ref_udata:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%" PRIx64, UValue);
    break;
  case DW_FORM_GNU_ref_alt:
    AddrOS << format("<alt 0x%" PRIx64 ">", UValue);
    break;

  // All DW_FORM_indirect attributes should be resolved prior to calling
  // this function
  case DW_FORM_indirect:
    OS << "DW_FORM_indirect";
    break;

  case DW_FORM_rnglistx:
    OS << format("indexed (0x%x) rangelist = ", (uint32_t)UValue);
    break;

  // Should be formatted to 64-bit for DWARF64.
  case DW_FORM_sec_offset:
    AddrOS << format("0x%08x", (uint32_t)UValue);
    break;

  default:
    OS << format("DW_FORM(0x%4.4x)", Form);
    break;
  }

  if (CURelativeOffset) {
    if (DumpOpts.Verbose)
      OS << " => {";
    if (DumpOpts.ShowAddresses)
      WithColor(OS, HighlightColor::Address).get()
          << format("0x%8.8" PRIx64, UValue + (U ? U->getOffset() : 0));
    if (DumpOpts.Verbose)
      OS << "}";
  }
}